

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestDirect.cpp
# Opt level: O0

bool ParseTestDirectLine(string *sString)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  syntax_option_type __f;
  int iVar4;
  value_type *pvVar5;
  char *pcVar6;
  ostream *poVar7;
  LLPoint LVar8;
  undefined1 local_800 [8];
  string sDestLong;
  string sDestLat;
  string local_7a0;
  LLPOINT local_780;
  double local_770;
  LLPoint ll;
  regex_error *e;
  string_type local_6c8;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_6a8;
  string_type local_620;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_600;
  string_type local_578;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_558;
  string_type local_4d0;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_4b0;
  string_type local_428;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_408;
  string_type local_380;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_360;
  string_type local_2d8;
  undefined1 local_2b8 [8];
  sregex_token_iterator s_end;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_228;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_220;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  undefined1 local_210 [8];
  sregex_token_iterator it;
  int sub_matches [7];
  undefined1 local_160 [8];
  regex pat;
  undefined1 local_138 [8];
  string sRxPat;
  string local_100 [4];
  syntax_option_type flags;
  string sComputedDestLong;
  string sComputedDestLat;
  string sAzimuth;
  string sDist;
  string sStartLong;
  string sStartLat;
  string sTestId;
  bool bPassed;
  string *sString_local;
  
  trim(sString," \t\n\r\f\v");
  std::__cxx11::string::string((string *)(sStartLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sStartLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sDist.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sAzimuth.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sComputedDestLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(sComputedDestLong.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_100);
  __f = std::regex_constants::operator|(1,0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_138,"([a-zA-Z]*\\d*)[,]",
             (allocator *)
             ((long)&pat._M_automaton.
                     super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pat._M_automaton.
                     super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::__cxx11::string::operator+=
            ((string *)local_138,
             "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]")
  ;
  std::__cxx11::string::operator+=
            ((string *)local_138,"([-+]?[0-9]*[.]?[0-9]+)[,]([-+]?[0-9]*[.]?[0-9]+)[,]");
  std::__cxx11::string::operator+=
            ((string *)local_138,
             "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])");
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_160,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,__f);
  it._M_has_m1 = true;
  it._129_7_ = 0x2000000;
  local_220._M_current = (char *)std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_218,&local_220);
  s_end._128_8_ = std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_228,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&s_end._M_has_m1);
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
  ::regex_token_iterator<7ul>
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
              *)local_210,local_218,local_228,(regex_type *)local_160,(int (*) [7])&it._M_has_m1,0);
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::regex_token_iterator
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
              *)local_2b8);
  bVar3 = std::__cxx11::
          regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
          ::operator!=((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                        *)local_210,
                       (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                        *)local_2b8);
  if (bVar3) {
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_360,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_210,0);
    pvVar5 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_360);
    std::__cxx11::sub_match::operator_cast_to_string(&local_2d8,(sub_match *)pvVar5);
    std::__cxx11::string::operator=
              ((string *)(sStartLat.field_2._M_local_buf + 8),(string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_360);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_408,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_210,0);
    pvVar5 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_408);
    std::__cxx11::sub_match::operator_cast_to_string(&local_380,(sub_match *)pvVar5);
    std::__cxx11::string::operator=
              ((string *)(sStartLong.field_2._M_local_buf + 8),(string *)&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_408);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_4b0,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_210,0);
    pvVar5 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_4b0);
    std::__cxx11::sub_match::operator_cast_to_string(&local_428,(sub_match *)pvVar5);
    std::__cxx11::string::operator=((string *)(sDist.field_2._M_local_buf + 8),(string *)&local_428)
    ;
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_4b0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_558,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_210,0);
    pvVar5 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_558);
    std::__cxx11::sub_match::operator_cast_to_string(&local_4d0,(sub_match *)pvVar5);
    std::__cxx11::string::operator=
              ((string *)(sAzimuth.field_2._M_local_buf + 8),(string *)&local_4d0);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_558);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_600,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_210,0);
    pvVar5 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_600);
    std::__cxx11::sub_match::operator_cast_to_string(&local_578,(sub_match *)pvVar5);
    std::__cxx11::string::operator=
              ((string *)(sComputedDestLat.field_2._M_local_buf + 8),(string *)&local_578);
    std::__cxx11::string::~string((string *)&local_578);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_600);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_6a8,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_210,0);
    pvVar5 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_6a8);
    std::__cxx11::sub_match::operator_cast_to_string(&local_620,(sub_match *)pvVar5);
    std::__cxx11::string::operator=
              ((string *)(sComputedDestLong.field_2._M_local_buf + 8),(string *)&local_620);
    std::__cxx11::string::~string((string *)&local_620);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_6a8);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&e,(regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                        *)local_210,0);
    pvVar5 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                          *)&e);
    std::__cxx11::sub_match::operator_cast_to_string(&local_6c8,(sub_match *)pvVar5);
    std::__cxx11::string::operator=(local_100,(string *)&local_6c8);
    std::__cxx11::string::~string((string *)&local_6c8);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&e);
  }
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_token_iterator
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
              *)local_2b8);
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_token_iterator
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
              *)local_210);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_160);
  std::__cxx11::string::~string((string *)local_138);
  std::__cxx11::string::string((string *)&local_7a0,(string *)(sStartLong.field_2._M_local_buf + 8))
  ;
  dVar1 = ParseLatitude(&local_7a0);
  dVar1 = Deg2Rad(dVar1);
  std::__cxx11::string::string
            ((string *)(sDestLat.field_2._M_local_buf + 8),
             (string *)(sDist.field_2._M_local_buf + 8));
  dVar2 = ParseLongitude((string *)((long)&sDestLat.field_2 + 8));
  dVar2 = Deg2Rad(dVar2);
  GeoCalcs::LLPOINT::LLPOINT(&local_780,dVar1,dVar2);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  dVar1 = atof(pcVar6);
  dVar1 = Deg2Rad(dVar1);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  dVar2 = atof(pcVar6);
  dVar2 = NmToMeters(dVar2);
  LVar8 = GeoCalcs::DestVincenty(&local_780,dVar1,dVar2);
  ll.latitude = LVar8.longitude;
  local_770 = LVar8.latitude;
  std::__cxx11::string::~string((string *)(sDestLat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_7a0);
  local_770 = Rad2Deg(local_770);
  ll.latitude = Rad2Deg(ll.latitude);
  ConvertLatitudeDdToDms_abi_cxx11_((string *)((long)&sDestLong.field_2 + 8),&local_770);
  ConvertLongitudeDdToDms_abi_cxx11_((string *)local_800,&ll.latitude);
  iVar4 = std::__cxx11::string::compare((string *)(sDestLong.field_2._M_local_buf + 8));
  if (iVar4 != 0) {
    poVar7 = std::operator<<((ostream *)&std::cout,"\n");
    poVar7 = std::operator<<(poVar7,(string *)(sStartLat.field_2._M_local_buf + 8));
    poVar7 = std::operator<<(poVar7,"failed: Expected latitude: ");
    poVar7 = std::operator<<(poVar7,(string *)(sComputedDestLong.field_2._M_local_buf + 8));
    poVar7 = std::operator<<(poVar7,"  calced: ");
    std::operator<<(poVar7,(string *)(sDestLong.field_2._M_local_buf + 8));
  }
  sTestId.field_2._M_local_buf[0xf] = iVar4 == 0;
  iVar4 = std::__cxx11::string::compare((string *)local_800);
  if (iVar4 != 0) {
    poVar7 = std::operator<<((ostream *)&std::cout,"\n");
    poVar7 = std::operator<<(poVar7,(string *)(sStartLat.field_2._M_local_buf + 8));
    poVar7 = std::operator<<(poVar7,"failed: Expected longitude: ");
    poVar7 = std::operator<<(poVar7,local_100);
    poVar7 = std::operator<<(poVar7,"  calced: ");
    std::operator<<(poVar7,(string *)local_800);
    sTestId.field_2._M_local_buf[0xf] = '\0';
  }
  ll.longitude._4_4_ = 1;
  std::__cxx11::string::~string((string *)local_800);
  std::__cxx11::string::~string((string *)(sDestLong.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string((string *)(sComputedDestLong.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sComputedDestLat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sAzimuth.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sDist.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sStartLong.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(sStartLat.field_2._M_local_buf + 8));
  return (bool)sTestId.field_2._M_local_buf[0xf];
}

Assistant:

bool ParseTestDirectLine(string sString)
{
    bool bPassed = true;
    trim(sString);
    string sTestId, sStartLat, sStartLong, sDist, sAzimuth;
    string sComputedDestLat, sComputedDestLong;

    try
    {
        regex_constants::syntax_option_type flags = regex_constants::icase | regex_constants::ECMAScript;

        string sRxPat = "([a-zA-Z]*\\d*)[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([-+]?[0-9]*[.]?[0-9]+)[,]([-+]?[0-9]*[.]?[0-9]+)[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])";
        regex pat(sRxPat, flags);

        int const sub_matches[] = {1, 2, 3, 4, 5, 6, 7,};
        sregex_token_iterator it(sString.begin(), sString.end(), pat, sub_matches);
        sregex_token_iterator s_end;
        if (it != s_end)
        {
            sTestId = *it++;
            sStartLat = *it++;
            sStartLong = *it++;
            sDist = *it++;
            sAzimuth = *it++;
            sComputedDestLat = *it++;
            sComputedDestLong = *it++;
        }
    }
    catch (regex_error &e)
    {
        cout << "\n" << e.what();
        return false;
    }


    LLPoint ll = DestVincenty(LLPoint(Deg2Rad(ParseLatitude(sStartLat)), Deg2Rad(ParseLongitude(sStartLong))),
                              Deg2Rad(atof(sAzimuth.c_str())), NmToMeters(atof(sDist.c_str())));
    ll.latitude = Rad2Deg(ll.latitude);
    ll.longitude = Rad2Deg(ll.longitude);
    string sDestLat = ConvertLatitudeDdToDms(ll.latitude); // + (ll.latitude < 0.0 ? + "S" : + "N");
    string sDestLong = ConvertLongitudeDdToDms(ll.longitude); // + (ll.longitude < 0.0 ? + "W" : + "E");
    //  double dComputedDestLat = ParseLatitude(sComputedDestLat);
    //  double dComputedDestLong = ParseLongitude(sComputedDestLong);

    if (sDestLat.compare(sComputedDestLat) != 0)
    {
        cout << "\n" << sTestId << "failed: Expected latitude: " << sComputedDestLat << "  calced: " << sDestLat;
        bPassed = false;
    }
    if (sDestLong.compare(sComputedDestLong) != 0)
    {
        cout << "\n" << sTestId << "failed: Expected longitude: " << sComputedDestLong << "  calced: " << sDestLong;
        bPassed = false;
    }
    return bPassed;
}